

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

CURLcode do_init_writer_stack(Curl_easy *data)

{
  Curl_cwriter *pCVar1;
  CURLcode CVar2;
  CURLcode CVar3;
  Curl_cwriter *in_RAX;
  Curl_cwriter *writer;
  Curl_cwriter *local_28;
  
  local_28 = in_RAX;
  CVar2 = Curl_cwriter_create(&(data->req).writer_stack,data,&Curl_cwt_out,CURL_CW_CLIENT);
  if (CVar2 == CURLE_OK) {
    CVar2 = Curl_cwriter_create(&local_28,data,&Curl_cwt_pause,CURL_CW_PROTOCOL);
    pCVar1 = local_28;
    if (CVar2 == CURLE_OK) {
      CVar2 = Curl_cwriter_add(data,local_28);
      if (CVar2 == CURLE_OK) {
        CVar2 = CURLE_OK;
      }
      else if (pCVar1 != (Curl_cwriter *)0x0) {
        (*pCVar1->cwt->do_close)(data,pCVar1);
        (*Curl_cfree)(pCVar1);
      }
    }
    if (CVar2 == CURLE_OK) {
      CVar2 = Curl_cwriter_create(&local_28,data,&cw_download,CURL_CW_PROTOCOL);
      pCVar1 = local_28;
      if (CVar2 == CURLE_OK) {
        CVar2 = Curl_cwriter_add(data,local_28);
        if (CVar2 == CURLE_OK) {
          CVar2 = CURLE_OK;
        }
        else if (pCVar1 != (Curl_cwriter *)0x0) {
          (*pCVar1->cwt->do_close)(data,pCVar1);
          (*Curl_cfree)(pCVar1);
        }
      }
      if (CVar2 == CURLE_OK) {
        CVar2 = Curl_cwriter_create(&local_28,data,&cw_raw,CURL_CW_RAW);
        if (((CVar2 == CURLE_OK) &&
            (CVar3 = Curl_cwriter_add(data,local_28), CVar2 = CURLE_OK, CVar3 != CURLE_OK)) &&
           (CVar2 = CVar3, local_28 != (Curl_cwriter *)0x0)) {
          (*local_28->cwt->do_close)(data,local_28);
          (*Curl_cfree)(local_28);
        }
      }
    }
  }
  return CVar2;
}

Assistant:

static CURLcode do_init_writer_stack(struct Curl_easy *data)
{
  struct Curl_cwriter *writer;
  CURLcode result;

  DEBUGASSERT(!data->req.writer_stack);
  result = Curl_cwriter_create(&data->req.writer_stack,
                               data, &Curl_cwt_out, CURL_CW_CLIENT);
  if(result)
    return result;

  /* This places the "pause" writer behind the "download" writer that
   * is added below. Meaning the "download" can do checks on content length
   * and other things *before* write outs are buffered for paused transfers. */
  result = Curl_cwriter_create(&writer, data, &Curl_cwt_pause,
                               CURL_CW_PROTOCOL);
  if(!result) {
    result = Curl_cwriter_add(data, writer);
    if(result)
      Curl_cwriter_free(data, writer);
  }
  if(result)
    return result;

  result = Curl_cwriter_create(&writer, data, &cw_download, CURL_CW_PROTOCOL);
  if(!result) {
    result = Curl_cwriter_add(data, writer);
    if(result)
      Curl_cwriter_free(data, writer);
  }
  if(result)
    return result;

  result = Curl_cwriter_create(&writer, data, &cw_raw, CURL_CW_RAW);
  if(!result) {
    result = Curl_cwriter_add(data, writer);
    if(result)
      Curl_cwriter_free(data, writer);
  }
  if(result)
    return result;

  return result;
}